

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoclient.cpp
# Opt level: O3

bool __thiscall
EOClient::Upload(EOClient *this,FileType type,string *filename,size_t file_start,size_t file_length,
                InitReply init_reply)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  int iVar5;
  FILE *__stream;
  ulong uVar6;
  size_t sVar7;
  runtime_error *this_00;
  bool bVar8;
  size_t sVar9;
  undefined1 auVar10 [16];
  array<char,_10UL> pub_header_bytes;
  PacketBuilder builder;
  undefined8 local_8a;
  undefined2 local_82;
  string local_80;
  PacketBuilder local_60;
  
  if (this->upload_fh != (FILE *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Already uploading file");
LAB_0013393e:
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (0xf9f8 < file_length) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"File is too large to send");
    goto LAB_0013393e;
  }
  __stream = fopen((filename->_M_dataplus)._M_p,"rb");
  this->upload_fh = (FILE *)__stream;
  if (__stream == (FILE *)0x0) {
LAB_001338c6:
    bVar8 = false;
  }
  else {
    if (file_length == 0) {
      iVar5 = fseek(__stream,0,2);
      if (iVar5 != 0) {
        fclose((FILE *)this->upload_fh);
        goto LAB_001338c6;
      }
      sVar9 = ftell((FILE *)this->upload_fh);
      fseek((FILE *)this->upload_fh,0,0);
    }
    else {
      sVar9 = file_length + 10;
    }
    this->upload_type = type;
    this->upload_pos = 0;
    this->upload_size = sVar9;
    uVar4 = (this->super_Client).send_buffer._M_string_length;
    do {
      uVar6 = uVar4;
      uVar4 = uVar6 * 2;
    } while (uVar6 < sVar9 + 6);
    std::__cxx11::string::resize((ulong)&this->send_buffer2,(char)uVar6);
    this->send_buffer2_gpos = 0;
    this->send_buffer2_ppos = 0;
    this->send_buffer2_used = 0;
    std::__cxx11::string::swap((string *)&(this->super_Client).send_buffer);
    sVar9 = this->send_buffer2_ppos;
    sVar2 = (this->super_Client).send_buffer_gpos;
    sVar3 = (this->super_Client).send_buffer_ppos;
    (this->super_Client).send_buffer_gpos = this->send_buffer2_gpos;
    (this->super_Client).send_buffer_ppos = sVar9;
    this->send_buffer2_gpos = sVar2;
    this->send_buffer2_ppos = sVar3;
    sVar9 = (this->super_Client).send_buffer_used;
    (this->super_Client).send_buffer_used = this->send_buffer2_used;
    this->send_buffer2_used = sVar9;
    PacketBuilder::PacketBuilder(&local_60,PACKET_F_INIT,PACKET_A_INIT,2);
    PacketBuilder::AddChar(&local_60,(uint)init_reply);
    if (type != FILE_MAP) {
      PacketBuilder::AddChar(&local_60,this->upload_file_id);
    }
    PacketBuilder::AddSize(&local_60,this->upload_size);
    PacketBuilder::operator_cast_to_string(&local_80,&local_60);
    Client::Send(&this->super_Client,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    bVar8 = true;
    if (file_start != 0) {
      sVar7 = fread(&local_8a,1,10,(FILE *)this->upload_fh);
      iVar5 = (int)sVar7;
      if ((ulong)(long)iVar5 < 10) {
        bVar8 = false;
      }
      else {
        pcVar1 = (this->super_Client).send_buffer._M_dataplus._M_p;
        sVar9 = (this->super_Client).send_buffer_ppos;
        *(undefined2 *)(pcVar1 + sVar9 + 8) = local_82;
        *(undefined8 *)(pcVar1 + sVar9) = local_8a;
        this->upload_pos = this->upload_pos + (long)iVar5;
        auVar10._0_8_ = (long)iVar5;
        auVar10._8_4_ = iVar5;
        auVar10._12_4_ = iVar5 >> 0x1f;
        (this->super_Client).send_buffer_ppos =
             auVar10._0_8_ + (this->super_Client).send_buffer_ppos;
        (this->super_Client).send_buffer_used =
             auVar10._8_8_ + (this->super_Client).send_buffer_used;
        if (file_start != 10) {
          fseek((FILE *)this->upload_fh,file_start,0);
        }
      }
    }
    PacketBuilder::~PacketBuilder(&local_60);
  }
  return bVar8;
}

Assistant:

bool EOClient::Upload(FileType type, const std::string &filename, std::size_t file_start, std::size_t file_length, InitReply init_reply)
{
	using std::swap;

	if (this->upload_fh)
		throw std::runtime_error("Already uploading file");

	if (file_length > 63992)
		throw std::runtime_error("File is too large to send");

	this->upload_fh = std::fopen(filename.c_str(), "rb");

	if (!this->upload_fh)
		return false;

	// The size of all pub file headers is 10 bytes
	std::array<char, 10> pub_header_bytes;

	if (file_length == 0)
	{
		if (std::fseek(this->upload_fh, 0, SEEK_END) != 0)
		{
			std::fclose(this->upload_fh);
			return false;
		}

		file_length = std::ftell(this->upload_fh);
		std::fseek(this->upload_fh, 0, SEEK_SET);
	}
	else
	{
		file_length += pub_header_bytes.size();
	}

	this->upload_type = type;
	this->upload_pos = 0;
	this->upload_size = file_length;

	std::size_t temp_buffer_size = this->send_buffer.size();

	// Allocate a power-of-two buffer size large enough to hold the file
	while (temp_buffer_size < this->upload_size + 6)
		temp_buffer_size *= 2;

	this->send_buffer2.resize(temp_buffer_size);
	this->send_buffer2_gpos = 0;
	this->send_buffer2_ppos = 0;
	this->send_buffer2_used = 0;

	swap(this->send_buffer, this->send_buffer2);
	swap(this->send_buffer_gpos, this->send_buffer2_gpos);
	swap(this->send_buffer_ppos, this->send_buffer2_ppos);
	swap(this->send_buffer_used, this->send_buffer2_used);

	// Build the file upload header packet
	PacketBuilder builder(PACKET_F_INIT, PACKET_A_INIT, 2);
	builder.AddChar(init_reply);

	if (type != FILE_MAP)
		builder.AddChar(this->upload_file_id);

	builder.AddSize(this->upload_size);

	Client::Send(builder);

	// Copy the header from dat001 in to higher numbered files
	if (file_start != 0)
	{
		int bytes_read = std::fread(&pub_header_bytes[0], 1, pub_header_bytes.size(), this->upload_fh);

		if (bytes_read < sizeof pub_header_bytes)
			return false;

		std::copy(pub_header_bytes.begin(), pub_header_bytes.end(), this->send_buffer.begin() + this->send_buffer_ppos);

		this->upload_pos += bytes_read;
		this->send_buffer_ppos += bytes_read;
		this->send_buffer_used += bytes_read;

		if (file_start != pub_header_bytes.size())
			std::fseek(this->upload_fh, file_start, SEEK_SET);
	}

	return true;
}